

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::computeDualInfeasibilitiesWithFixedVariableFlips(HEkkDual *this)

{
  reference pvVar1;
  reference pvVar2;
  double *pdVar3;
  long in_RDI;
  double dual_infeasibility;
  double dual;
  double upper;
  double lower;
  HighsInt iVar;
  HighsInt num_tot;
  HighsOptions *options;
  HighsSimplexInfo *info;
  SimplexBasis *basis;
  HighsLp *lp;
  double sum_dual_infeasibility;
  double max_dual_infeasibility;
  HighsInt num_dual_infeasibility;
  double local_68;
  double local_60;
  double local_58;
  value_type local_50;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  long local_30;
  int *local_28;
  double local_20;
  double local_18;
  int local_c;
  
  local_c = 0;
  local_18 = 0.0;
  local_20 = 0.0;
  local_28 = (int *)(*(long *)(in_RDI + 0x10) + 0x2198);
  local_30 = *(long *)(in_RDI + 0x10) + 0x2978;
  local_38 = *(long *)(in_RDI + 0x10) + 0x2560;
  local_40 = *(long *)(*(long *)(in_RDI + 0x10) + 8);
  local_44 = *local_28 + *(int *)(*(long *)(in_RDI + 0x10) + 0x219c);
  for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
    pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(local_30 + 0x18),
                        (long)local_48);
    if (*pvVar1 != '\0') {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_38 + 0x48),
                          (long)local_48);
      local_50 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_38 + 0x60),
                          (long)local_48);
      local_58 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_38 + 0x18),
                          (long)local_48);
      local_60 = *pvVar2;
      local_68 = 0.0;
      if ((((local_50 != -INFINITY) || (NAN(local_50))) || (local_58 != INFINITY)) ||
         (NAN(local_58))) {
        pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(local_30 + 0x30),
                            (long)local_48);
        local_68 = (double)-(int)*pvVar1 * local_60;
      }
      else {
        local_68 = ABS(local_60);
      }
      if (0.0 < local_68) {
        if (*(double *)(local_40 + 0x120) <= local_68) {
          local_c = local_c + 1;
        }
        pdVar3 = std::max<double>(&local_68,&local_18);
        local_18 = *pdVar3;
        local_20 = local_68 + local_20;
      }
    }
  }
  *(int *)(local_38 + 0x390) = local_c;
  *(double *)(local_38 + 0x398) = local_18;
  *(double *)(local_38 + 0x3a0) = local_20;
  return;
}

Assistant:

void HEkkDual::computeDualInfeasibilitiesWithFixedVariableFlips() {
  // Computes num/max/sum of dual infeasibilities, ignoring fixed
  // variables whose infeasibilities can be corrected by flipping at
  // the fixed value, so that decisions on the dual simplex phase can
  // be taken. It is driven by the use of nonbasicMove to identify
  // dual infeasibilities, using the bounds only to identify free
  // variables. Fixed variables are assumed to have nonbasicMove=0 so
  // that no dual infeasibility is counted for them. Indeed, when
  // called from cleanup() at the end of dual phase 1, nonbasicMove
  // relates to the phase 1 bounds, but workLower and workUpper will
  // have been set to phase 2 values! Note that there can be no free
  // variables in dual phase 1.
  HighsInt num_dual_infeasibility = 0;
  double max_dual_infeasibility = 0;
  double sum_dual_infeasibility = 0;
  HighsLp& lp = ekk_instance_.lp_;
  SimplexBasis& basis = ekk_instance_.basis_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsOptions* options = ekk_instance_.options_;
  const HighsInt num_tot = lp.num_col_ + lp.num_row_;
  // Possibly verify that nonbasicMove is correct for fixed variables
  // debugFixedNonbasicMove(ekk_instance_);
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) continue;
    // Nonbasic column
    const double lower = info.workLower_[iVar];
    const double upper = info.workUpper_[iVar];
    const double dual = info.workDual_[iVar];
    double dual_infeasibility = 0;
    if (lower == -kHighsInf && upper == kHighsInf) {
      dual_infeasibility = fabs(dual);
    } else {
      dual_infeasibility = -basis.nonbasicMove_[iVar] * dual;
    }
    if (dual_infeasibility > 0) {
      if (dual_infeasibility >= options->dual_feasibility_tolerance)
        num_dual_infeasibility++;
      max_dual_infeasibility =
          std::max(dual_infeasibility, max_dual_infeasibility);
      sum_dual_infeasibility += dual_infeasibility;
    }
  }
  info.num_dual_infeasibilities = num_dual_infeasibility;
  info.max_dual_infeasibility = max_dual_infeasibility;
  info.sum_dual_infeasibilities = sum_dual_infeasibility;
}